

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::writeToBinary(Binasc *this,ostream *out,istream *input)

{
  byte bVar1;
  int iVar2;
  int local_58;
  int status;
  int lineNum;
  undefined1 local_48 [8];
  string inputLine;
  istream *input_local;
  ostream *out_local;
  Binasc *this_local;
  
  inputLine.field_2._8_8_ = input;
  std::__cxx11::string::string((string *)local_48);
  std::__cxx11::string::reserve((ulong)local_48);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)inputLine.field_2._8_8_,(string *)local_48,'\n');
  local_58 = 1;
  do {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      this_local._4_4_ = 1;
LAB_0015264c:
      std::__cxx11::string::~string((string *)local_48);
      return this_local._4_4_;
    }
    iVar2 = processLine(this,out,(string *)local_48,local_58);
    if (iVar2 == 0) {
      this_local._4_4_ = 0;
      goto LAB_0015264c;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)inputLine.field_2._8_8_,(string *)local_48,'\n');
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

int Binasc::writeToBinary(std::ostream& out, std::istream& input) {
	std::string inputLine;
	inputLine.reserve(8196);
	int  lineNum = 0;              // current line number
	getline(input, inputLine, '\n');
	lineNum++;
	while (!input.eof()) {
		int status = processLine(out, inputLine, lineNum);
		if (!status) {
			return 0;
		}
		getline(input, inputLine, '\n');
		lineNum++;
	}
	return 1;
}